

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall doctest::String::operator=(String *this,String *other)

{
  char *pcVar1;
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  
  if (this != other) {
    if (((this->field_0).buf[0x17] < '\0') &&
       (pcVar1 = (this->field_0).data.ptr, pcVar1 != (char *)0x0)) {
      operator_delete__(pcVar1);
      in_RDX = extraout_RDX;
    }
    copy(this,(EVP_PKEY_CTX *)other,in_RDX);
  }
  return this;
}

Assistant:

String& String::operator=(const String& other) {
    if(this != &other) {
        if(!isOnStack())
            delete[] data.ptr;

        copy(other);
    }

    return *this;
}